

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

void loader_impl_destroy_handle(loader_handle_impl handle_impl)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  long *plVar4;
  size_t sVar5;
  
  if (handle_impl != (loader_handle_impl)0x0) {
    if (handle_impl->impl->init == 0) {
      iVar2 = loader_impl_function_hook_call(handle_impl->ctx,"__metacall_finalize__");
      if (iVar2 != 0) {
        log_write_impl_va("metacall",0x27d,"loader_impl_destroy_handle",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,LOG_LEVEL_ERROR,"Error when calling destructor from handle impl: %p (%s)"
                          ,handle_impl,"__metacall_finalize__");
      }
      if (handle_impl->module != (loader_handle)0x0) {
        iVar2 = (*handle_impl->iface->clear)(handle_impl->impl,handle_impl->module);
        if (iVar2 != 0) {
          log_write_impl_va("metacall",0x282,"loader_impl_destroy_handle",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                            ,LOG_LEVEL_ERROR,"Error when clearing handle impl: %p",handle_impl);
        }
      }
    }
    if (handle_impl->populated == 0) {
      context_remove(handle_impl->impl->ctx,handle_impl->ctx);
    }
    sVar3 = vector_size(handle_impl->populated_handles);
    if (sVar3 != 0) {
      sVar3 = 0;
      do {
        plVar4 = (long *)vector_at(handle_impl->populated_handles,sVar3);
        lVar1 = *plVar4;
        if (*(int *)(lVar1 + 0x1028) == 0) {
          context_remove(*(context *)(*(long *)(lVar1 + 8) + 0x30),handle_impl->ctx);
        }
        context_remove(*(context *)(lVar1 + 0x1020),handle_impl->ctx);
        sVar3 = sVar3 + 1;
        sVar5 = vector_size(handle_impl->populated_handles);
      } while (sVar3 < sVar5);
    }
    context_destroy(handle_impl->ctx);
    vector_destroy(handle_impl->populated_handles);
    free(handle_impl);
    return;
  }
  return;
}

Assistant:

void loader_impl_destroy_handle(loader_handle_impl handle_impl)
{
	if (handle_impl != NULL)
	{
		static const char func_fini_name[] = LOADER_IMPL_FUNCTION_FINI;
		size_t iterator;

		if (handle_impl->impl->init == 0)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */
			/* log_write("metacall", LOG_LEVEL_DEBUG, "Destroying handle %s", handle_impl->path); */

			if (loader_impl_function_hook_call(handle_impl->ctx, func_fini_name) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Error when calling destructor from handle impl: %p (%s)", (void *)handle_impl, func_fini_name);
			}

			if (handle_impl->module != NULL && handle_impl->iface->clear(handle_impl->impl, handle_impl->module) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Error when clearing handle impl: %p", (void *)handle_impl);
			}
		}

		if (handle_impl->populated == 0)
		{
			context_remove(handle_impl->impl->ctx, handle_impl->ctx);
		}

		for (iterator = 0; iterator < vector_size(handle_impl->populated_handles); ++iterator)
		{
			loader_handle_impl populated_handle_impl = vector_at_type(handle_impl->populated_handles, iterator, loader_handle_impl);

			if (populated_handle_impl->populated == 0)
			{
				context_remove(populated_handle_impl->impl->ctx, handle_impl->ctx);
			}

			context_remove(populated_handle_impl->ctx, handle_impl->ctx);
		}

		context_destroy(handle_impl->ctx);
		vector_destroy(handle_impl->populated_handles);
		handle_impl->magic = (uintptr_t)loader_handle_impl_magic_free;

		free(handle_impl);
	}
}